

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

void PHYSFS_freeList(void *list)

{
  long *local_18;
  void **i;
  void *list_local;
  
  local_18 = (long *)list;
  if (list != (void *)0x0) {
    for (; *local_18 != 0; local_18 = local_18 + 1) {
      (*__PHYSFS_AllocatorHooks.Free)((void *)*local_18);
    }
    (*__PHYSFS_AllocatorHooks.Free)(list);
  }
  return;
}

Assistant:

void PHYSFS_freeList(void *list)
{
    void **i;
    if (list != NULL)
    {
        for (i = (void **) list; *i != NULL; i++)
            allocator.Free(*i);

        allocator.Free(list);
    } /* if */
}